

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

string * __thiscall
Problem::getStringFromState_abi_cxx11_(string *__return_storage_ptr__,Problem *this,State *state)

{
  pointer pnVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  char *pcVar6;
  pointer piVar7;
  ulong uVar8;
  long *plVar9;
  pointer piVar10;
  vector<node,_std::allocator<node>_> *pvVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  string currString;
  string __str;
  string __str_1;
  vector<int,_std::allocator<int>_> bidNos;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  string *local_f8;
  ulong local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  ulong local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  vector<int,_std::allocator<int>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  State *local_80;
  Problem *local_78;
  long local_70;
  char *local_68 [2];
  char local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  local_f8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  local_80 = state;
  State::getBidNumbers(&local_a0,state);
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar8 = 0;
    piVar7 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar10 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    local_78 = this;
    do {
      uVar15 = (ulong)piVar7[uVar8];
      if (0 < (long)uVar15) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"[","");
        pnVar1 = this->problemData[uVar8].super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_70 = (long)pnVar1[uVar15].norc;
        local_f0 = uVar8;
        local_c8 = uVar15;
        if (0 < local_70) {
          lVar14 = 0;
          do {
            uVar12 = pnVar1[uVar15].region[lVar14];
            uVar2 = -uVar12;
            if (0 < (int)uVar12) {
              uVar2 = uVar12;
            }
            uVar13 = 1;
            if (9 < uVar2) {
              uVar8 = (ulong)uVar2;
              uVar3 = 4;
              do {
                uVar13 = uVar3;
                uVar4 = (uint)uVar8;
                if (uVar4 < 100) {
                  uVar13 = uVar13 - 2;
                  goto LAB_0010380f;
                }
                if (uVar4 < 1000) {
                  uVar13 = uVar13 - 1;
                  goto LAB_0010380f;
                }
                if (uVar4 < 10000) goto LAB_0010380f;
                uVar8 = uVar8 / 10000;
                uVar3 = uVar13 + 4;
              } while (99999 < uVar4);
              uVar13 = uVar13 + 1;
            }
LAB_0010380f:
            local_118 = &local_108;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_118,(char)uVar13 - (char)((int)uVar12 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_118),uVar13,uVar2);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
            plVar9 = plVar5 + 2;
            if ((long *)*plVar5 == plVar9) {
              local_d8 = *plVar9;
              lStack_d0 = plVar5[3];
              local_e8 = &local_d8;
            }
            else {
              local_d8 = *plVar9;
              local_e8 = (long *)*plVar5;
            }
            local_e0 = plVar5[1];
            *plVar5 = (long)plVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_e8);
            if (local_e8 != &local_d8) {
              operator_delete(local_e8);
            }
            if (local_118 != &local_108) {
              operator_delete(local_118);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != local_70);
        }
        std::__cxx11::string::replace
                  ((ulong)&local_138,local_138._M_string_length - 1,(char *)0x1,0x1080a4);
        pcVar6 = (char *)std::__cxx11::string::append((char *)local_f8);
        uVar12 = 1;
        if (9 < local_f0) {
          uVar8 = local_f0;
          uVar2 = 4;
          do {
            uVar12 = uVar2;
            uVar13 = (uint)uVar8;
            if (uVar13 < 100) {
              uVar12 = uVar12 - 2;
              goto LAB_0010396a;
            }
            if (uVar13 < 1000) {
              uVar12 = uVar12 - 1;
              goto LAB_0010396a;
            }
            if (uVar13 < 10000) goto LAB_0010396a;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar2 = uVar12 + 4;
          } while (99999 < uVar13);
          uVar12 = uVar12 + 1;
        }
LAB_0010396a:
        local_e8 = &local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,(char)uVar12);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,uVar12,(uint)local_f0);
        pcVar6 = (char *)std::__cxx11::string::_M_append(pcVar6,(ulong)local_e8);
        this = local_78;
        pcVar6 = (char *)std::__cxx11::string::append(pcVar6);
        uVar12 = 1;
        if (9 < (uint)local_c8) {
          uVar8 = local_c8;
          uVar2 = 4;
          do {
            uVar12 = uVar2;
            uVar13 = (uint)uVar8;
            if (uVar13 < 100) {
              uVar12 = uVar12 - 2;
              goto LAB_00103a13;
            }
            if (uVar13 < 1000) {
              uVar12 = uVar12 - 1;
              goto LAB_00103a13;
            }
            if (uVar13 < 10000) goto LAB_00103a13;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar2 = uVar12 + 4;
          } while (99999 < uVar13);
          uVar12 = uVar12 + 1;
        }
LAB_00103a13:
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct((ulong)local_68,(char)uVar12);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0],uVar12,(uint)local_c8);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x108049);
        local_c0 = &local_b0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_b0 = *plVar9;
          lStack_a8 = plVar5[3];
        }
        else {
          local_b0 = *plVar9;
          local_c0 = (long *)*plVar5;
        }
        local_b8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_118 = &local_108;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_108 = *plVar9;
          lStack_100 = plVar5[3];
        }
        else {
          local_108 = *plVar9;
          local_118 = (long *)*plVar5;
        }
        local_110 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pcVar6 = (char *)std::__cxx11::string::_M_append(pcVar6,(ulong)local_118);
        pcVar6 = (char *)std::__cxx11::string::_M_append(pcVar6,(ulong)local_138._M_dataplus._M_p);
        std::__cxx11::string::append(pcVar6);
        uVar8 = local_f0;
        if (local_118 != &local_108) {
          operator_delete(local_118);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        piVar7 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
          piVar7 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar10 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)piVar10 - (long)piVar7 >> 2));
  }
  pcVar6 = (char *)std::__cxx11::string::append((char *)local_f8);
  State::getBidNumbers(&local_48,local_80);
  if ((long)this->numCompanies < 1) {
    dVar16 = 0.0;
  }
  else {
    pvVar11 = this->problemData;
    dVar16 = 0.0;
    lVar14 = 0;
    do {
      dVar16 = dVar16 + (pvVar11->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                        super__Vector_impl_data._M_start
                        [local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar14]].price;
      lVar14 = lVar14 + 1;
      pvVar11 = pvVar11 + 1;
    } while (this->numCompanies != lVar14);
  }
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_138,vsnprintf,0x148,"%f",dVar16);
  std::__cxx11::string::_M_append(pcVar6,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_f8;
}

Assistant:

std::string Problem::getStringFromState(State state) {
    string stateString = "{";
    vector<int> bidNos = state.getBidNumbers();
    for (int i = 0; i < bidNos.size(); ++i) {
        int curBidNumber = bidNos[i];
        if(curBidNumber>0){
            string currString = "[";
            int *curRegions = this->problemData[i][curBidNumber].region;
            int curRegionsSize = this->problemData[i][curBidNumber].norc;
            for (int j = 0; j < curRegionsSize; j++) {
                currString.append(to_string(curRegions[j]) + " ");
            }
            currString.replace(currString.length()-1, 1, "]");
            stateString.append("(").append(to_string(i)).append(",").append(" "+to_string(curBidNumber)+": ").append(currString).append(")");
        }
    }
    stateString.append("}").append(to_string(getStateCost(state.getBidNumbers())));
    return stateString;
}